

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcWin.c
# Opt level: O2

int Wlc_ObjHasArithm_rec(Wlc_Ntk_t *p,Wlc_Obj_t *pObj)

{
  int Id;
  uint uVar1;
  
  do {
    uVar1 = *(ushort *)pObj & 0x3f;
    if (0x2d < uVar1) {
LAB_003161f2:
      return (uint)((short)uVar1 == 0x32);
    }
    if ((0x3008080UL >> uVar1 & 1) == 0) {
      if ((0x380000000000U >> uVar1 & 1) != 0) {
        return 1;
      }
      if (uVar1 == 6) {
        return 0;
      }
      goto LAB_003161f2;
    }
    Id = Wlc_ObjFaninId(pObj,0);
    pObj = Wlc_NtkObj(p,Id);
  } while( true );
}

Assistant:

int Wlc_ObjHasArithm_rec( Wlc_Ntk_t * p, Wlc_Obj_t * pObj )
{
    if ( pObj->Type == WLC_OBJ_CONST )
        return 0;
    if ( pObj->Type == WLC_OBJ_BUF         || pObj->Type == WLC_OBJ_BIT_NOT ||
         pObj->Type == WLC_OBJ_BIT_ZEROPAD || pObj->Type == WLC_OBJ_BIT_SIGNEXT )
         return Wlc_ObjHasArithm_rec( p, Wlc_ObjFanin0(p, pObj) );
    return pObj->Type == WLC_OBJ_ARI_ADD   || pObj->Type == WLC_OBJ_ARI_SUB || 
           pObj->Type == WLC_OBJ_ARI_MULTI || pObj->Type == WLC_OBJ_ARI_MINUS;
}